

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O1

string * findMatchingHeader(string *__return_storage_ptr__,string *absPath,string *mocSubDir,
                           string *basename,
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *headerExtensions)

{
  bool bVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  pointer pbVar5;
  string sourceFilePath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_68 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_68;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pbVar5 = (headerExtensions->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_70 = __return_storage_ptr__;
  if (pbVar5 != (headerExtensions->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_60 = headerExtensions;
    local_58 = absPath;
    do {
      std::operator+(&local_d0,local_58,basename);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_80 = *plVar3;
        lStack_78 = plVar2[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar3;
        local_90 = (long *)*plVar2;
      }
      local_88 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_90,(ulong)(pbVar5->_M_dataplus)._M_p);
      local_b0 = &local_a0;
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_a0 = *plVar3;
        lStack_98 = plVar2[3];
      }
      else {
        local_a0 = *plVar3;
        local_b0 = (long *)*plVar2;
      }
      local_a8 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      bVar1 = cmsys::SystemTools::FileExists((char *)local_b0);
      if (bVar1) {
LAB_0026d27f:
        std::__cxx11::string::_M_assign((string *)local_70);
        if (local_b0 == &local_a0) {
          return local_70;
        }
        operator_delete(local_b0,local_a0 + 1);
        return local_70;
      }
      if (mocSubDir->_M_string_length != 0) {
        std::operator+(&local_50,mocSubDir,basename);
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        psVar4 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_d0.field_2._M_allocated_capacity = *psVar4;
          local_d0.field_2._8_8_ = plVar2[3];
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar4;
          local_d0._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_d0._M_string_length = plVar2[1];
        *plVar2 = (long)psVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_d0,(ulong)(pbVar5->_M_dataplus)._M_p);
        plVar3 = plVar2 + 2;
        if ((long *)*plVar2 == plVar3) {
          local_80 = *plVar3;
          lStack_78 = plVar2[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar3;
          local_90 = (long *)*plVar2;
        }
        local_88 = plVar2[1];
        *plVar2 = (long)plVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        bVar1 = cmsys::SystemTools::FileExists((char *)local_b0);
        if (bVar1) goto LAB_0026d27f;
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,local_a0 + 1);
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != (local_60->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return local_70;
}

Assistant:

static std::string findMatchingHeader(const std::string& absPath,
                                      const std::string& mocSubDir,
                                      const std::string& basename,
                              const std::vector<std::string>& headerExtensions)
{
  std::string header;
  for(std::vector<std::string>::const_iterator ext = headerExtensions.begin();
      ext != headerExtensions.end();
      ++ext)
    {
    std::string sourceFilePath = absPath + basename + "." + (*ext);
    if (cmsys::SystemTools::FileExists(sourceFilePath.c_str()))
      {
      header = sourceFilePath;
      break;
      }
    if (!mocSubDir.empty())
      {
      sourceFilePath = mocSubDir + basename + "." + (*ext);
      if (cmsys::SystemTools::FileExists(sourceFilePath.c_str()))
        {
        header = sourceFilePath;
        break;
        }
      }
    }

  return header;
}